

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx512.cpp
# Opt level: O0

int __thiscall ncnn::LSTM_x86_avx512::create_pipeline(LSTM_x86_avx512 *this,Option *opt)

{
  int *piVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  byte *in_RSI;
  long in_RDI;
  int i_3;
  int i_2;
  float *weight_hc_IFOG_1;
  float *weight_xc_IFOG_1;
  float *weight_hc_G_2;
  float *weight_hc_O_2;
  float *weight_hc_F_2;
  float *weight_hc_I_2;
  float *weight_xc_G_2;
  float *weight_xc_O_2;
  float *weight_xc_F_2;
  float *weight_xc_I_2;
  int i_1;
  int i;
  float *weight_hc_IFOG;
  float *weight_xc_IFOG;
  float *weight_hc_G_1;
  float *weight_hc_O_1;
  float *weight_hc_F_1;
  float *weight_hc_I_1;
  float *weight_hc_G;
  float *weight_hc_O;
  float *weight_hc_F;
  float *weight_hc_I;
  float *weight_xc_G_1;
  float *weight_xc_O_1;
  float *weight_xc_F_1;
  float *weight_xc_I_1;
  float *weight_xc_G;
  float *weight_xc_O;
  float *weight_xc_F;
  float *weight_xc_I;
  int q;
  float *bias_c_IFOG;
  float *bias_c_G;
  float *bias_c_O;
  float *bias_c_F;
  float *bias_c_I;
  Mat weight_hc_data_packed_dr;
  Mat bias_c_data_packed_dr;
  Mat weight_xc_data_packed_dr;
  Mat weight_hc;
  Mat bias_c;
  Mat weight_xc;
  int dr;
  int size;
  int num_directions;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  undefined8 in_stack_fffffffffffff430;
  int _elempack;
  size_t in_stack_fffffffffffff438;
  undefined8 in_stack_fffffffffffff440;
  int _c;
  undefined8 in_stack_fffffffffffff448;
  Mat *in_stack_fffffffffffff450;
  Option *in_stack_fffffffffffff480;
  LSTM_x86_avx512 *in_stack_fffffffffffff488;
  Allocator *in_stack_fffffffffffff4b0;
  int local_9e0;
  int local_9dc;
  undefined4 *local_9d8;
  undefined4 *local_9d0;
  int local_988;
  int local_984;
  undefined4 *local_980;
  undefined4 *local_978;
  int local_8ec;
  undefined4 *local_8e8;
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined4 local_8a8;
  undefined8 local_8a0;
  undefined4 local_898;
  undefined4 local_894;
  undefined4 local_890;
  undefined4 local_88c;
  undefined4 local_888;
  undefined8 local_880;
  undefined8 local_878;
  undefined8 local_870;
  undefined8 local_868;
  undefined4 local_860;
  undefined8 local_858;
  undefined4 local_850;
  undefined4 local_84c;
  undefined4 local_848;
  undefined4 local_844;
  undefined4 local_840;
  undefined8 local_838;
  undefined8 local_830;
  undefined8 local_828;
  undefined8 local_820;
  undefined4 local_818;
  undefined8 local_810;
  undefined4 local_808;
  undefined4 local_804;
  undefined4 local_800;
  undefined4 local_7fc;
  undefined4 local_7f8;
  undefined8 local_7f0;
  undefined8 local_7e8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  undefined4 local_7d0;
  undefined8 local_7c8;
  undefined4 local_7c0;
  undefined4 local_7bc;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined4 local_7b0;
  undefined8 local_7a8;
  undefined8 local_790;
  undefined8 local_788;
  undefined8 local_780;
  undefined4 local_778;
  undefined8 local_770;
  undefined4 local_768;
  undefined4 local_764;
  undefined4 local_760;
  undefined4 local_75c;
  undefined4 local_758;
  undefined8 local_750;
  undefined8 local_748;
  undefined8 local_740;
  undefined8 local_738;
  undefined4 local_730;
  undefined8 local_728;
  undefined4 local_720;
  undefined4 local_71c;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 local_710;
  undefined8 local_708;
  int local_6fc;
  int local_6f8;
  int local_6f4;
  byte *local_6f0;
  int local_6dc;
  undefined8 *local_6d8;
  undefined8 *local_6c8;
  undefined8 *local_6b8;
  undefined8 *local_6a8;
  undefined8 *local_698;
  undefined8 *local_688;
  undefined1 local_675;
  int local_674;
  long *local_670;
  undefined8 *local_668;
  undefined1 local_655;
  int local_654;
  long *local_650;
  undefined8 *local_648;
  undefined1 local_635;
  int local_634;
  long *local_630;
  undefined8 *local_628;
  undefined1 local_615;
  int local_614;
  long *local_610;
  undefined8 *local_608;
  undefined1 local_5f5;
  int local_5f4;
  long *local_5f0;
  undefined8 *local_5e8;
  undefined1 local_5d5;
  int local_5d4;
  long *local_5d0;
  undefined8 *local_5c8;
  int local_5b4;
  undefined8 *local_5b0;
  int local_5a4;
  undefined8 *local_5a0;
  int local_594;
  undefined8 *local_590;
  int local_584;
  undefined8 *local_580;
  int local_574;
  undefined8 *local_570;
  int local_564;
  undefined8 *local_560;
  int local_554;
  undefined8 *local_550;
  int local_544;
  undefined8 *local_540;
  int local_534;
  undefined8 *local_530;
  int local_524;
  undefined8 *local_520;
  int local_514;
  undefined8 *local_510;
  int local_504;
  undefined8 *local_500;
  int local_4f4;
  undefined8 *local_4f0;
  int local_4e4;
  undefined8 *local_4e0;
  int local_4d4;
  undefined8 *local_4d0;
  int local_4c4;
  undefined8 *local_4c0;
  int local_4b4;
  undefined8 *local_4b0;
  int local_4a4;
  undefined8 *local_4a0;
  int local_494;
  undefined8 *local_490;
  int local_484;
  undefined8 *local_480;
  int local_474;
  undefined8 *local_470;
  int local_464;
  undefined8 *local_460;
  int local_454;
  undefined8 *local_450;
  int local_444;
  undefined8 *local_440;
  undefined4 local_434;
  undefined8 *local_430;
  undefined4 local_424;
  undefined8 *local_420;
  undefined4 local_414;
  undefined8 *local_410;
  undefined4 local_404;
  undefined8 *local_400;
  int local_3f4;
  undefined8 *local_3f0;
  int local_3e4;
  undefined8 *local_3e0;
  int local_3d4;
  undefined8 *local_3d0;
  int local_3c4;
  undefined8 *local_3c0;
  undefined4 local_3b4;
  undefined8 *local_3b0;
  undefined8 *local_330;
  undefined8 *local_310;
  undefined8 *local_2f0;
  undefined8 *local_2d0;
  undefined8 *local_2b0;
  undefined8 *local_290;
  int local_288;
  undefined4 local_284;
  undefined8 *local_280;
  int local_278;
  undefined4 local_274;
  undefined8 *local_270;
  int local_268;
  undefined4 local_264;
  undefined8 *local_260;
  undefined8 local_258;
  undefined4 local_24c;
  long local_248;
  long local_240;
  undefined4 local_234;
  int local_230;
  int local_22c;
  undefined8 *local_228;
  undefined8 local_220;
  undefined4 local_214;
  long local_210;
  long local_208;
  undefined4 local_1fc;
  int local_1f8;
  int local_1f4;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  long local_1d0;
  undefined4 local_1c4;
  int local_1c0;
  int local_1bc;
  undefined8 *local_1b8;
  undefined8 local_1b0;
  undefined4 local_1a4;
  long local_1a0;
  long local_198;
  undefined4 local_18c;
  int local_188;
  int local_184;
  undefined8 *local_180;
  undefined8 local_178;
  undefined4 local_16c;
  long local_168;
  undefined4 *local_160;
  undefined4 local_154;
  int local_150;
  int local_14c;
  undefined8 *local_148;
  undefined8 local_140;
  undefined4 local_134;
  long local_130;
  long local_128;
  undefined4 local_11c;
  int local_118;
  int local_114;
  undefined8 *local_110;
  undefined4 local_104;
  long local_100;
  undefined4 local_f4;
  long local_f0;
  undefined4 local_e4;
  long local_e0;
  undefined4 local_d4;
  long local_d0;
  undefined4 local_c4;
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  void *local_a8;
  void *local_a0;
  void *local_98;
  
  _c = (int)((ulong)in_stack_fffffffffffff440 >> 0x20);
  if (*(int *)(in_RDI + 0xe0) == 0) {
    local_6f4 = 1;
    if (*(int *)(in_RDI + 0xd8) == 2) {
      local_6f4 = 2;
    }
    uVar2 = (long)*(int *)(in_RDI + 0xd4) / (long)local_6f4;
    uVar2 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
            (long)*(int *)(in_RDI + 0xdc);
    local_6f8 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 4);
    _elempack = (int)((ulong)in_stack_fffffffffffff430 >> 0x20);
    local_6f0 = in_RSI;
    Mat::create(in_stack_fffffffffffff450,(int)((ulong)in_stack_fffffffffffff448 >> 0x20),
                (int)in_stack_fffffffffffff448,_c,in_stack_fffffffffffff438,_elempack,
                in_stack_fffffffffffff4b0);
    Mat::create(in_stack_fffffffffffff450,(int)((ulong)in_stack_fffffffffffff448 >> 0x20),
                (int)in_stack_fffffffffffff448,_c,in_stack_fffffffffffff438,_elempack,
                in_stack_fffffffffffff4b0);
    Mat::create(in_stack_fffffffffffff450,(int)((ulong)in_stack_fffffffffffff448 >> 0x20),
                (int)in_stack_fffffffffffff448,_c,in_stack_fffffffffffff438,_elempack,
                in_stack_fffffffffffff4b0);
    for (local_6fc = 0; local_6fc < local_6f4; local_6fc = local_6fc + 1) {
      local_5d0 = (long *)(in_RDI + 0x130);
      local_5c8 = &local_748;
      local_22c = *(int *)(in_RDI + 0x15c);
      local_230 = *(int *)(in_RDI + 0x160);
      local_234 = *(undefined4 *)(in_RDI + 0x164);
      local_240 = *local_5d0 +
                  *(long *)(in_RDI + 0x170) * (long)local_6fc * *(long *)(in_RDI + 0x140);
      local_248 = *(long *)(in_RDI + 0x140);
      local_24c = *(undefined4 *)(in_RDI + 0x148);
      local_258 = *(undefined8 *)(in_RDI + 0x150);
      local_228 = &local_748;
      local_b0 = (long)local_22c * (long)local_230 * local_248;
      local_5f0 = (long *)(in_RDI + 0x178);
      local_5e8 = &local_790;
      local_1f4 = *(int *)(in_RDI + 0x1a4);
      local_1f8 = *(int *)(in_RDI + 0x1a8);
      local_1fc = *(undefined4 *)(in_RDI + 0x1ac);
      local_208 = *local_5f0 +
                  *(long *)(in_RDI + 0x1b8) * (long)local_6fc * *(long *)(in_RDI + 0x188);
      local_210 = *(long *)(in_RDI + 0x188);
      local_214 = *(undefined4 *)(in_RDI + 400);
      local_220 = *(undefined8 *)(in_RDI + 0x198);
      local_1f0 = &local_790;
      local_c0 = (long)local_1f4 * (long)local_1f8 * local_210;
      local_610 = (long *)(in_RDI + 0xe8);
      local_608 = &local_7e8;
      local_1bc = *(int *)(in_RDI + 0x114);
      local_1c0 = *(int *)(in_RDI + 0x118);
      local_1c4 = *(undefined4 *)(in_RDI + 0x11c);
      local_1d0 = *local_610 +
                  *(long *)(in_RDI + 0x128) * (long)local_6fc * *(long *)(in_RDI + 0xf8);
      local_1d8 = *(long *)(in_RDI + 0xf8);
      local_1dc = *(undefined4 *)(in_RDI + 0x100);
      local_1e8 = *(undefined8 *)(in_RDI + 0x108);
      local_1b8 = &local_7e8;
      local_d0 = (long)local_1bc * (long)local_1c0 * local_1d8;
      local_630 = (long *)(in_RDI + 0x298);
      local_628 = &local_830;
      local_184 = *(int *)(in_RDI + 0x2c4);
      local_188 = *(int *)(in_RDI + 0x2c8);
      local_18c = *(undefined4 *)(in_RDI + 0x2cc);
      local_198 = *local_630 +
                  *(long *)(in_RDI + 0x2d8) * (long)local_6fc * *(long *)(in_RDI + 0x2a8);
      local_1a0 = *(long *)(in_RDI + 0x2a8);
      local_1a4 = *(undefined4 *)(in_RDI + 0x2b0);
      local_1b0 = *(undefined8 *)(in_RDI + 0x2b8);
      local_180 = &local_830;
      local_e0 = (long)local_184 * (long)local_188 * local_1a0;
      local_650 = (long *)(in_RDI + 0x2e0);
      local_648 = &local_878;
      local_14c = *(int *)(in_RDI + 0x30c);
      local_150 = *(int *)(in_RDI + 0x310);
      local_154 = *(undefined4 *)(in_RDI + 0x314);
      local_160 = (undefined4 *)
                  (*local_650 +
                  *(long *)(in_RDI + 800) * (long)local_6fc * *(long *)(in_RDI + 0x2f0));
      local_168 = *(long *)(in_RDI + 0x2f0);
      local_16c = *(undefined4 *)(in_RDI + 0x2f8);
      local_178 = *(undefined8 *)(in_RDI + 0x300);
      local_148 = &local_878;
      local_f0 = (long)local_14c * (long)local_150 * local_168;
      local_670 = (long *)(in_RDI + 0x328);
      local_668 = &local_8c0;
      local_114 = *(int *)(in_RDI + 0x354);
      local_118 = *(int *)(in_RDI + 0x358);
      local_11c = *(undefined4 *)(in_RDI + 0x35c);
      local_128 = *local_670 +
                  *(long *)(in_RDI + 0x368) * (long)local_6fc * *(long *)(in_RDI + 0x338);
      local_130 = *(long *)(in_RDI + 0x338);
      local_134 = *(undefined4 *)(in_RDI + 0x340);
      local_140 = *(undefined8 *)(in_RDI + 0x348);
      local_110 = &local_8c0;
      local_100 = (long)local_114 * (long)local_118 * local_130;
      local_400 = &local_790;
      local_410 = &local_790;
      lVar3 = local_208 + local_1f4 * local_210;
      local_420 = &local_790;
      lVar4 = local_208 + (long)local_1f4 * 2 * local_210;
      local_430 = &local_790;
      lVar5 = local_208 + (long)local_1f4 * 3 * local_210;
      local_3b0 = &local_878;
      local_8e8 = local_160;
      for (local_8ec = 0; local_8ec + 1 < *(int *)(in_RDI + 0xdc); local_8ec = local_8ec + 2) {
        *local_8e8 = *(undefined4 *)(local_208 + (long)local_8ec * 4);
        local_8e8[1] = *(undefined4 *)(lVar3 + (long)local_8ec * 4);
        local_8e8[2] = *(undefined4 *)(lVar4 + (long)local_8ec * 4);
        local_8e8[3] = *(undefined4 *)(lVar5 + (long)local_8ec * 4);
        local_8e8[4] = *(undefined4 *)(local_208 + (long)(local_8ec + 1) * 4);
        local_8e8[5] = *(undefined4 *)(lVar3 + (long)(local_8ec + 1) * 4);
        local_8e8[6] = *(undefined4 *)(lVar4 + (long)(local_8ec + 1) * 4);
        local_8e8[7] = *(undefined4 *)(lVar5 + (long)(local_8ec + 1) * 4);
        local_8e8 = local_8e8 + 8;
        local_440 = &local_748;
        local_444 = local_8ec;
        local_454 = *(int *)(in_RDI + 0xdc) + local_8ec;
        local_450 = &local_748;
        local_464 = *(int *)(in_RDI + 0xdc) * 2 + local_8ec;
        local_460 = &local_748;
        local_474 = *(int *)(in_RDI + 0xdc) * 3 + local_8ec;
        local_470 = &local_748;
        local_484 = local_8ec + 1;
        local_480 = &local_748;
        local_494 = *(int *)(in_RDI + 0xdc) + local_8ec + 1;
        local_490 = &local_748;
        local_4a4 = *(int *)(in_RDI + 0xdc) * 2 + local_8ec + 1;
        local_4a0 = &local_748;
        local_4b4 = *(int *)(in_RDI + 0xdc) * 3 + local_8ec + 1;
        local_4b0 = &local_748;
        local_4c0 = &local_7e8;
        local_4c4 = local_8ec;
        local_4d4 = *(int *)(in_RDI + 0xdc) + local_8ec;
        local_4d0 = &local_7e8;
        local_4e4 = *(int *)(in_RDI + 0xdc) * 2 + local_8ec;
        local_4e0 = &local_7e8;
        local_4f4 = *(int *)(in_RDI + 0xdc) * 3 + local_8ec;
        local_4f0 = &local_7e8;
        local_504 = local_8ec + 1;
        local_500 = &local_7e8;
        local_514 = *(int *)(in_RDI + 0xdc) + local_8ec + 1;
        local_510 = &local_7e8;
        local_524 = *(int *)(in_RDI + 0xdc) * 2 + local_8ec + 1;
        local_520 = &local_7e8;
        local_534 = *(int *)(in_RDI + 0xdc) * 3 + local_8ec + 1;
        local_530 = &local_7e8;
        local_3c4 = local_8ec / 2;
        local_3c0 = &local_830;
        local_978 = (undefined4 *)(local_198 + (long)local_184 * (long)local_3c4 * local_1a0);
        local_3d4 = local_8ec / 2;
        local_3d0 = &local_8c0;
        local_980 = (undefined4 *)(local_128 + (long)local_114 * (long)local_3d4 * local_130);
        for (local_984 = 0; local_984 < local_6f8; local_984 = local_984 + 1) {
          *local_978 = *(undefined4 *)
                        (local_240 + (long)local_22c * (long)local_8ec * local_248 +
                        (long)local_984 * 4);
          local_978[1] = *(undefined4 *)
                          (local_240 + (long)local_22c * (long)local_454 * local_248 +
                          (long)local_984 * 4);
          local_978[2] = *(undefined4 *)
                          (local_240 + (long)local_22c * (long)local_464 * local_248 +
                          (long)local_984 * 4);
          local_978[3] = *(undefined4 *)
                          (local_240 + (long)local_22c * (long)local_474 * local_248 +
                          (long)local_984 * 4);
          local_978[4] = *(undefined4 *)
                          (local_240 + (long)local_22c * (long)local_484 * local_248 +
                          (long)local_984 * 4);
          local_978[5] = *(undefined4 *)
                          (local_240 + (long)local_22c * (long)local_494 * local_248 +
                          (long)local_984 * 4);
          local_978[6] = *(undefined4 *)
                          (local_240 + (long)local_22c * (long)local_4a4 * local_248 +
                          (long)local_984 * 4);
          local_978[7] = *(undefined4 *)
                          (local_240 + (long)local_22c * (long)local_4b4 * local_248 +
                          (long)local_984 * 4);
          local_978 = local_978 + 8;
        }
        for (local_988 = 0; local_988 < *(int *)(in_RDI + 0xd0); local_988 = local_988 + 1) {
          *local_980 = *(undefined4 *)
                        (local_1d0 + (long)local_1bc * (long)local_8ec * local_1d8 +
                        (long)local_988 * 4);
          local_980[1] = *(undefined4 *)
                          (local_1d0 + (long)local_1bc * (long)local_4d4 * local_1d8 +
                          (long)local_988 * 4);
          local_980[2] = *(undefined4 *)
                          (local_1d0 + (long)local_1bc * (long)local_4e4 * local_1d8 +
                          (long)local_988 * 4);
          local_980[3] = *(undefined4 *)
                          (local_1d0 + (long)local_1bc * (long)local_4f4 * local_1d8 +
                          (long)local_988 * 4);
          local_980[4] = *(undefined4 *)
                          (local_1d0 + (long)local_1bc * (long)local_504 * local_1d8 +
                          (long)local_988 * 4);
          local_980[5] = *(undefined4 *)
                          (local_1d0 + (long)local_1bc * (long)local_514 * local_1d8 +
                          (long)local_988 * 4);
          local_980[6] = *(undefined4 *)
                          (local_1d0 + (long)local_1bc * (long)local_524 * local_1d8 +
                          (long)local_988 * 4);
          local_980[7] = *(undefined4 *)
                          (local_1d0 + (long)local_1bc * (long)local_534 * local_1d8 +
                          (long)local_988 * 4);
          local_980 = local_980 + 8;
        }
      }
      for (; local_8ec < *(int *)(in_RDI + 0xdc); local_8ec = local_8ec + 1) {
        *local_8e8 = *(undefined4 *)(local_208 + (long)local_8ec * 4);
        local_8e8[1] = *(undefined4 *)(lVar3 + (long)local_8ec * 4);
        local_8e8[2] = *(undefined4 *)(lVar4 + (long)local_8ec * 4);
        local_8e8[3] = *(undefined4 *)(lVar5 + (long)local_8ec * 4);
        local_8e8 = local_8e8 + 4;
        local_540 = &local_748;
        local_544 = local_8ec;
        local_554 = *(int *)(in_RDI + 0xdc) + local_8ec;
        local_550 = &local_748;
        local_564 = *(int *)(in_RDI + 0xdc) * 2 + local_8ec;
        local_560 = &local_748;
        local_574 = *(int *)(in_RDI + 0xdc) * 3 + local_8ec;
        local_570 = &local_748;
        local_580 = &local_7e8;
        local_584 = local_8ec;
        local_594 = *(int *)(in_RDI + 0xdc) + local_8ec;
        local_590 = &local_7e8;
        local_5a4 = *(int *)(in_RDI + 0xdc) * 2 + local_8ec;
        local_5a0 = &local_7e8;
        local_5b4 = *(int *)(in_RDI + 0xdc) * 3 + local_8ec;
        local_5b0 = &local_7e8;
        local_3e4 = local_8ec / 2 + local_8ec % 2;
        local_3e0 = &local_830;
        local_9d0 = (undefined4 *)(local_198 + (long)local_184 * (long)local_3e4 * local_1a0);
        local_3f4 = local_8ec / 2 + local_8ec % 2;
        local_3f0 = &local_8c0;
        local_9d8 = (undefined4 *)(local_128 + (long)local_114 * (long)local_3f4 * local_130);
        for (local_9dc = 0; local_9dc < local_6f8; local_9dc = local_9dc + 1) {
          *local_9d0 = *(undefined4 *)
                        (local_240 + (long)local_22c * (long)local_8ec * local_248 +
                        (long)local_9dc * 4);
          local_9d0[1] = *(undefined4 *)
                          (local_240 + (long)local_22c * (long)local_554 * local_248 +
                          (long)local_9dc * 4);
          local_9d0[2] = *(undefined4 *)
                          (local_240 + (long)local_22c * (long)local_564 * local_248 +
                          (long)local_9dc * 4);
          local_9d0[3] = *(undefined4 *)
                          (local_240 + (long)local_22c * (long)local_574 * local_248 +
                          (long)local_9dc * 4);
          local_9d0 = local_9d0 + 4;
        }
        for (local_9e0 = 0; local_9e0 < *(int *)(in_RDI + 0xd0); local_9e0 = local_9e0 + 1) {
          *local_9d8 = *(undefined4 *)
                        (local_1d0 + (long)local_1bc * (long)local_8ec * local_1d8 +
                        (long)local_9e0 * 4);
          local_9d8[1] = *(undefined4 *)
                          (local_1d0 + (long)local_1bc * (long)local_594 * local_1d8 +
                          (long)local_9e0 * 4);
          local_9d8[2] = *(undefined4 *)
                          (local_1d0 + (long)local_1bc * (long)local_5a4 * local_1d8 +
                          (long)local_9e0 * 4);
          local_9d8[3] = *(undefined4 *)
                          (local_1d0 + (long)local_1bc * (long)local_5b4 * local_1d8 +
                          (long)local_9e0 * 4);
          local_9d8 = local_9d8 + 4;
        }
      }
      local_6d8 = &local_8c0;
      local_6c8 = &local_878;
      local_6b8 = &local_830;
      local_6a8 = &local_7e8;
      local_698 = &local_790;
      local_7b0 = 0;
      local_7b4 = 0;
      local_7b8 = 0;
      local_7bc = 0;
      local_7d0 = 0;
      local_7d8 = 0;
      local_7e0 = 0;
      local_7e8 = 0;
      local_7f8 = 0;
      local_7fc = 0;
      local_800 = 0;
      local_804 = 0;
      local_818 = 0;
      local_820 = 0;
      local_828 = 0;
      local_830 = 0;
      local_840 = 0;
      local_844 = 0;
      local_848 = 0;
      local_84c = 0;
      local_860 = 0;
      local_868 = 0;
      local_870 = 0;
      local_878 = 0;
      local_888 = 0;
      local_88c = 0;
      local_890 = 0;
      local_894 = 0;
      local_8a8 = 0;
      local_8b0 = 0;
      local_8b8 = 0;
      local_8c0 = 0;
      local_7a8 = 0;
      local_7c0 = 0;
      local_7f0 = 0;
      local_808 = 0;
      local_838 = 0;
      local_850 = 0;
      local_880 = 0;
      local_898 = 0;
      local_790 = 0;
      local_780 = 0;
      local_778 = 0;
      local_768 = 0;
      local_764 = 0;
      local_760 = 0;
      local_75c = 0;
      local_758 = 0;
      local_750 = 0;
      local_788 = 0;
      local_688 = &local_748;
      local_b4 = 0x10;
      local_c4 = 0x10;
      local_d4 = 0x10;
      local_e4 = 0x10;
      local_f4 = 0x10;
      local_104 = 0x10;
      local_3b4 = 0;
      local_404 = 0;
      local_414 = 1;
      local_424 = 2;
      local_434 = 3;
      local_5d4 = local_6fc;
      local_5d5 = 1;
      local_5f4 = local_6fc;
      local_5f5 = 1;
      local_614 = local_6fc;
      local_615 = 1;
      local_634 = local_6fc;
      local_635 = 1;
      local_654 = local_6fc;
      local_655 = 1;
      local_674 = local_6fc;
      local_675 = 1;
      local_748 = 0;
      local_738 = 0;
      local_730 = 0;
      local_720 = 0;
      local_71c = 0;
      local_718 = 0;
      local_714 = 0;
      local_710 = 0;
      local_708 = 0;
      local_740 = 0;
      local_330 = local_688;
      local_310 = local_698;
      local_2f0 = local_6a8;
      local_2d0 = local_6b8;
      local_2b0 = local_6c8;
      local_290 = local_6d8;
      local_8a0 = local_140;
      local_858 = local_178;
      local_810 = local_1b0;
      local_7c8 = local_1e8;
      local_770 = local_220;
      local_728 = local_258;
    }
    if ((*local_6f0 & 1) != 0) {
      puVar6 = (undefined8 *)(in_RDI + 0x130);
      local_260 = puVar6;
      if (*(long *)(in_RDI + 0x138) != 0) {
        piVar1 = *(int **)(in_RDI + 0x138);
        local_264 = 0xffffffff;
        LOCK();
        local_268 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_268 == 1) {
          if (*(long *)(in_RDI + 0x150) == 0) {
            local_a8 = (void *)*puVar6;
            if (local_a8 != (void *)0x0) {
              free(local_a8);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x150) + 0x18))(*(long **)(in_RDI + 0x150),*puVar6);
          }
        }
      }
      *puVar6 = 0;
      *(undefined8 *)(in_RDI + 0x140) = 0;
      *(undefined4 *)(in_RDI + 0x148) = 0;
      *(undefined4 *)(in_RDI + 0x158) = 0;
      *(undefined4 *)(in_RDI + 0x15c) = 0;
      *(undefined4 *)(in_RDI + 0x160) = 0;
      *(undefined4 *)(in_RDI + 0x164) = 0;
      *(undefined4 *)(in_RDI + 0x168) = 0;
      *(undefined8 *)(in_RDI + 0x170) = 0;
      *(undefined8 *)(in_RDI + 0x138) = 0;
      puVar6 = (undefined8 *)(in_RDI + 0x178);
      local_270 = puVar6;
      if (*(long *)(in_RDI + 0x180) != 0) {
        piVar1 = *(int **)(in_RDI + 0x180);
        local_274 = 0xffffffff;
        LOCK();
        local_278 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_278 == 1) {
          if (*(long *)(in_RDI + 0x198) == 0) {
            local_a0 = (void *)*puVar6;
            if (local_a0 != (void *)0x0) {
              free(local_a0);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x198) + 0x18))(*(long **)(in_RDI + 0x198),*puVar6);
          }
        }
      }
      *puVar6 = 0;
      *(undefined8 *)(in_RDI + 0x188) = 0;
      *(undefined4 *)(in_RDI + 400) = 0;
      *(undefined4 *)(in_RDI + 0x1a0) = 0;
      *(undefined4 *)(in_RDI + 0x1a4) = 0;
      *(undefined4 *)(in_RDI + 0x1a8) = 0;
      *(undefined4 *)(in_RDI + 0x1ac) = 0;
      *(undefined4 *)(in_RDI + 0x1b0) = 0;
      *(undefined8 *)(in_RDI + 0x1b8) = 0;
      *(undefined8 *)(in_RDI + 0x180) = 0;
      puVar6 = (undefined8 *)(in_RDI + 0xe8);
      if (*(long *)(in_RDI + 0xf0) != 0) {
        piVar1 = *(int **)(in_RDI + 0xf0);
        local_284 = 0xffffffff;
        LOCK();
        local_288 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_288 == 1) {
          local_280 = puVar6;
          if (*(long *)(in_RDI + 0x108) == 0) {
            local_98 = (void *)*puVar6;
            if (local_98 != (void *)0x0) {
              free(local_98);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x108) + 0x18))(*(long **)(in_RDI + 0x108),*puVar6);
          }
        }
      }
      *puVar6 = 0;
      *(undefined8 *)(in_RDI + 0xf8) = 0;
      *(undefined4 *)(in_RDI + 0x100) = 0;
      *(undefined4 *)(in_RDI + 0x110) = 0;
      *(undefined4 *)(in_RDI + 0x114) = 0;
      *(undefined4 *)(in_RDI + 0x118) = 0;
      *(undefined4 *)(in_RDI + 0x11c) = 0;
      *(undefined4 *)(in_RDI + 0x120) = 0;
      *(undefined8 *)(in_RDI + 0x128) = 0;
      *(undefined8 *)(in_RDI + 0xf0) = 0;
    }
    local_6dc = 0;
  }
  else {
    local_6dc = create_pipeline_int8(in_stack_fffffffffffff488,in_stack_fffffffffffff480);
  }
  return local_6dc;
}

Assistant:

int LSTM_x86_avx512::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return create_pipeline_int8(opt);
    }
#endif

    // pack IFOG
    int num_directions = direction == 2 ? 2 : 1;
    int size = weight_data_size / num_directions / hidden_size / 4;

#if __AVX__
    weight_xc_data_packed.create(size, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
#else
    weight_xc_data_packed.create(size, hidden_size, num_directions, 16u, 4);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size, num_directions, 16u, 4);
#endif

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int dr = 0; dr < num_directions; dr++)
    {
        const Mat weight_xc = weight_xc_data.channel(dr);
        const Mat bias_c = bias_c_data.channel(dr);
        const Mat weight_hc = weight_hc_data.channel(dr);

        Mat weight_xc_data_packed_dr = weight_xc_data_packed.channel(dr);
        Mat bias_c_data_packed_dr = bias_c_data_packed.channel(dr);
        Mat weight_hc_data_packed_dr = weight_hc_data_packed.channel(dr);

        const float* bias_c_I = bias_c.row(0);
        const float* bias_c_F = bias_c.row(1);
        const float* bias_c_O = bias_c.row(2);
        const float* bias_c_G = bias_c.row(3);

        float* bias_c_IFOG = bias_c_data_packed_dr.row(0);

        int q = 0;
#if __AVX__
        for (; q + 1 < hidden_size; q += 2)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];
            bias_c_IFOG[4] = bias_c_I[q + 1];
            bias_c_IFOG[5] = bias_c_F[q + 1];
            bias_c_IFOG[6] = bias_c_O[q + 1];
            bias_c_IFOG[7] = bias_c_G[q + 1];

            bias_c_IFOG += 8;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(hidden_size * 0 + q + 1);
            const float* weight_xc_F_1 = weight_xc.row(hidden_size * 1 + q + 1);
            const float* weight_xc_O_1 = weight_xc.row(hidden_size * 2 + q + 1);
            const float* weight_xc_G_1 = weight_xc.row(hidden_size * 3 + q + 1);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(hidden_size * 0 + q + 1);
            const float* weight_hc_F_1 = weight_hc.row(hidden_size * 1 + q + 1);
            const float* weight_hc_O_1 = weight_hc.row(hidden_size * 2 + q + 1);
            const float* weight_hc_G_1 = weight_hc.row(hidden_size * 3 + q + 1);

            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2);

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];
                weight_xc_IFOG[4] = weight_xc_I_1[i];
                weight_xc_IFOG[5] = weight_xc_F_1[i];
                weight_xc_IFOG[6] = weight_xc_O_1[i];
                weight_xc_IFOG[7] = weight_xc_G_1[i];

                weight_xc_IFOG += 8;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];
                weight_hc_IFOG[4] = weight_hc_I_1[i];
                weight_hc_IFOG[5] = weight_hc_F_1[i];
                weight_hc_IFOG[6] = weight_hc_O_1[i];
                weight_hc_IFOG[7] = weight_hc_G_1[i];

                weight_hc_IFOG += 8;
            }
        }
#endif // __AVX__
        for (; q < hidden_size; q++)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];

            bias_c_IFOG += 4;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);

#if __AVX__
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2 + q % 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2 + q % 2);
#else
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q);
#endif

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];

                weight_xc_IFOG += 4;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];

                weight_hc_IFOG += 4;
            }
        }
    }

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
    }

    return 0;
}